

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkv_interface.cpp
# Opt level: O0

void __thiscall MkvInterface::handleTracksData(MkvInterface *this)

{
  EbmlStream *pEVar1;
  EbmlString *pEVar2;
  FILE *pFVar3;
  bool bVar4;
  byte bVar5;
  uint8 uVar6;
  int iVar7;
  uint32 uVar8;
  undefined4 extraout_var;
  EbmlElement *pEVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  string *psVar10;
  undefined8 uVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong uVar12;
  size_t sVar13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  EbmlUInteger *pEVar14;
  undefined4 extraout_var_11;
  EbmlFloat *this_00;
  IOCallback *pIVar15;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  float fVar16;
  KaxVideoFrameRate *FrameRate;
  size_t local_130;
  EbmlUInteger *local_128;
  KaxVideoPixelHeight *PixelHeight;
  size_t local_118;
  EbmlUInteger *local_110;
  KaxVideoPixelWidth *PixelWidth;
  size_t local_100;
  EbmlUInteger *local_f8;
  KaxVideoFlagInterlaced *Interlaced;
  size_t local_e8;
  uint local_dc;
  EbmlMaster *pEStack_d8;
  uint j;
  KaxTrackVideo *TrackVideo;
  size_t local_c8;
  EbmlUInteger *local_c0;
  KaxTrackUID *TrackUID;
  size_t local_b0;
  string local_a8 [32];
  EbmlString *local_88;
  KaxCodecID *CodecID;
  size_t local_78;
  EbmlId local_70;
  EbmlUInteger *local_60;
  KaxTrackType *TrackType;
  size_t local_50;
  EbmlUInteger *local_48;
  KaxTrackNumber *TrackNum;
  size_t local_38;
  uint32 local_2c;
  uint local_28;
  int trackUID;
  int trackNr;
  bool videoTrackFound;
  size_t local_18;
  MkvInterface *local_10;
  MkvInterface *this_local;
  
  pEVar1 = this->aStream;
  local_10 = this;
  iVar7 = (*this->m_element1->_vptr_EbmlElement[4])();
  pEVar9 = libebml::EbmlStream::FindNextElement
                     (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var,iVar7) + 0x18),
                      &this->m_upperElementa,0xffffffff,(bool)(this->m_allowDummy & 1),1);
  this->m_element2a = pEVar9;
  do {
    while( true ) {
      if ((this->m_element2a == (EbmlElement *)0x0) || (0 < this->m_upperElementa))
      goto LAB_001b2f72;
      if (this->m_upperElementa < 0) {
        this->m_upperElementa = 0;
      }
      iVar7 = (*this->m_element2a->_vptr_EbmlElement[3])();
      _trackNr = *(undefined8 *)CONCAT44(extraout_var_00,iVar7);
      local_18 = ((undefined8 *)CONCAT44(extraout_var_00,iVar7))[1];
      bVar4 = libebml::EbmlId::operator==
                        ((EbmlId *)&trackNr,(EbmlId *)libmatroska::KaxTrackEntry::ClassInfos._8_8_);
      if (bVar4) {
        pEVar1 = this->aStream;
        iVar7 = (*this->m_element2a->_vptr_EbmlElement[4])();
        pEVar9 = libebml::EbmlStream::FindNextElement
                           (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_01,iVar7) + 0x18)
                            ,&this->m_upperElementa,0xffffffff,(bool)(this->m_allowDummy & 1),1);
        this->m_element3a = pEVar9;
        trackUID._3_1_ = 0;
        local_28 = 0xffffffff;
        local_2c = 0xffffffff;
        while ((this->m_element3a != (EbmlElement *)0x0 && (this->m_upperElementa < 1))) {
          if (this->m_upperElementa < 0) {
            this->m_upperElementa = 0;
          }
          iVar7 = (*this->m_element3a->_vptr_EbmlElement[3])();
          TrackNum = *(KaxTrackNumber **)CONCAT44(extraout_var_02,iVar7);
          local_38 = ((undefined8 *)CONCAT44(extraout_var_02,iVar7))[1];
          bVar4 = libebml::EbmlId::operator==
                            ((EbmlId *)&TrackNum,
                             (EbmlId *)libmatroska::KaxTrackNumber::ClassInfos._8_8_);
          if (bVar4) {
            pEVar14 = (EbmlUInteger *)this->m_element3a;
            local_48 = pEVar14;
            pIVar15 = libebml::EbmlStream::I_O(this->aStream);
            (*(pEVar14->super_EbmlElement)._vptr_EbmlElement[10])(pEVar14,pIVar15,1);
            bVar5 = libebml::EbmlUInteger::operator_cast_to_unsigned_char(local_48);
            local_28 = (uint)bVar5;
            fprintf(_stderr,"\tTrack # %d\n",(ulong)local_28);
          }
          else {
            iVar7 = (*this->m_element3a->_vptr_EbmlElement[3])();
            TrackType = *(KaxTrackType **)CONCAT44(extraout_var_03,iVar7);
            local_50 = ((undefined8 *)CONCAT44(extraout_var_03,iVar7))[1];
            bVar4 = libebml::EbmlId::operator==
                              ((EbmlId *)&TrackType,
                               (EbmlId *)libmatroska::KaxTrackType::ClassInfos._8_8_);
            if (bVar4) {
              pEVar14 = (EbmlUInteger *)this->m_element3a;
              local_60 = pEVar14;
              pIVar15 = libebml::EbmlStream::I_O(this->aStream);
              (*(pEVar14->super_EbmlElement)._vptr_EbmlElement[10])(pEVar14,pIVar15,1);
              fprintf(_stderr,"\tTrack type : ");
              uVar6 = libebml::EbmlUInteger::operator_cast_to_unsigned_char(local_60);
              if (uVar6 == '\x01') {
                fprintf(_stderr,"Video");
                trackUID._3_1_ = 1;
              }
              else if (uVar6 == '\x02') {
                fprintf(_stderr,"Audio");
              }
              else {
                fprintf(_stderr,"unknown");
              }
              fprintf(_stderr,"\n");
            }
            else {
              iVar7 = (*this->m_element3a->_vptr_EbmlElement[3])();
              local_70._0_8_ = *(undefined8 *)CONCAT44(extraout_var_04,iVar7);
              local_70.Length = ((undefined8 *)CONCAT44(extraout_var_04,iVar7))[1];
              bVar4 = libebml::EbmlId::operator==
                                (&local_70,
                                 (EbmlId *)libmatroska::KaxTrackFlagLacing::ClassInfos._8_8_);
              if (bVar4) {
                fprintf(_stderr,"\tFlag Lacing\n");
              }
              else {
                iVar7 = (*this->m_element3a->_vptr_EbmlElement[3])();
                CodecID = *(KaxCodecID **)CONCAT44(extraout_var_05,iVar7);
                local_78 = ((undefined8 *)CONCAT44(extraout_var_05,iVar7))[1];
                bVar4 = libebml::EbmlId::operator==
                                  ((EbmlId *)&CodecID,
                                   (EbmlId *)libmatroska::KaxCodecID::ClassInfos._8_8_);
                if (bVar4) {
                  pEVar2 = (EbmlString *)this->m_element3a;
                  local_88 = pEVar2;
                  pIVar15 = libebml::EbmlStream::I_O(this->aStream);
                  (*(pEVar2->super_EbmlElement)._vptr_EbmlElement[10])(pEVar2,pIVar15,1);
                  pFVar3 = _stderr;
                  psVar10 = libebml::EbmlString::operator_cast_to_string_(local_88);
                  std::__cxx11::string::string(local_a8,(string *)psVar10);
                  uVar11 = std::__cxx11::string::c_str();
                  fprintf(pFVar3,"\tCodec ID   : %s\n",uVar11);
                  std::__cxx11::string::~string(local_a8);
                }
                else {
                  iVar7 = (*this->m_element3a->_vptr_EbmlElement[3])();
                  TrackUID = *(KaxTrackUID **)CONCAT44(extraout_var_06,iVar7);
                  local_b0 = ((undefined8 *)CONCAT44(extraout_var_06,iVar7))[1];
                  bVar4 = libebml::EbmlId::operator==
                                    ((EbmlId *)&TrackUID,
                                     (EbmlId *)libmatroska::KaxTrackUID::ClassInfos._8_8_);
                  if (bVar4) {
                    pEVar14 = (EbmlUInteger *)this->m_element3a;
                    local_c0 = pEVar14;
                    pIVar15 = libebml::EbmlStream::I_O(this->aStream);
                    (*(pEVar14->super_EbmlElement)._vptr_EbmlElement[10])(pEVar14,pIVar15,1);
                    local_2c = libebml::EbmlUInteger::operator_cast_to_unsigned_int(local_c0);
                    fprintf(_stderr,"\tTrack UID   : %d\n",(ulong)local_2c);
                  }
                  else {
                    iVar7 = (*this->m_element3a->_vptr_EbmlElement[3])();
                    TrackVideo = *(KaxTrackVideo **)CONCAT44(extraout_var_07,iVar7);
                    local_c8 = ((undefined8 *)CONCAT44(extraout_var_07,iVar7))[1];
                    bVar4 = libebml::EbmlId::operator==
                                      ((EbmlId *)&TrackVideo,
                                       (EbmlId *)libmatroska::KaxTrackVideo::ClassInfos._8_8_);
                    if (bVar4) {
                      pEStack_d8 = (EbmlMaster *)this->m_element3a;
                      for (local_dc = 0; uVar12 = (ulong)local_dc,
                          sVar13 = libebml::EbmlMaster::ListSize(pEStack_d8), uVar12 < sVar13;
                          local_dc = local_dc + 1) {
                        pEVar9 = libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                        iVar7 = (*pEVar9->_vptr_EbmlElement[3])();
                        Interlaced = *(KaxVideoFlagInterlaced **)CONCAT44(extraout_var_08,iVar7);
                        local_e8 = ((undefined8 *)CONCAT44(extraout_var_08,iVar7))[1];
                        bVar4 = libebml::EbmlId::operator==
                                          ((EbmlId *)&Interlaced,
                                           (EbmlId *)
                                           libmatroska::KaxVideoFlagInterlaced::ClassInfos._8_8_);
                        if (bVar4) {
                          pEVar14 = (EbmlUInteger *)
                                    libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                          local_f8 = pEVar14;
                          pIVar15 = libebml::EbmlStream::I_O(this->aStream);
                          (*(pEVar14->super_EbmlElement)._vptr_EbmlElement[10])(pEVar14,pIVar15,1);
                          pFVar3 = _stderr;
                          uVar8 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(local_f8);
                          fprintf(pFVar3,"\tInterlaced : %d\n",(ulong)uVar8);
                        }
                        else {
                          pEVar9 = libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                          iVar7 = (*pEVar9->_vptr_EbmlElement[3])();
                          PixelWidth = *(KaxVideoPixelWidth **)CONCAT44(extraout_var_09,iVar7);
                          local_100 = ((undefined8 *)CONCAT44(extraout_var_09,iVar7))[1];
                          bVar4 = libebml::EbmlId::operator==
                                            ((EbmlId *)&PixelWidth,
                                             (EbmlId *)
                                             libmatroska::KaxVideoPixelWidth::ClassInfos._8_8_);
                          if (bVar4) {
                            pEVar14 = (EbmlUInteger *)
                                      libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                            local_110 = pEVar14;
                            pIVar15 = libebml::EbmlStream::I_O(this->aStream);
                            (*(pEVar14->super_EbmlElement)._vptr_EbmlElement[10])(pEVar14,pIVar15,1)
                            ;
                            pFVar3 = _stderr;
                            uVar8 = libebml::EbmlUInteger::operator_cast_to_unsigned_int(local_110);
                            fprintf(pFVar3,"\tPixelWidth : %d\n",(ulong)uVar8);
                          }
                          else {
                            pEVar9 = libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                            iVar7 = (*pEVar9->_vptr_EbmlElement[3])();
                            PixelHeight = *(KaxVideoPixelHeight **)CONCAT44(extraout_var_10,iVar7);
                            local_118 = ((undefined8 *)CONCAT44(extraout_var_10,iVar7))[1];
                            bVar4 = libebml::EbmlId::operator==
                                              ((EbmlId *)&PixelHeight,
                                               (EbmlId *)
                                               libmatroska::KaxVideoPixelHeight::ClassInfos._8_8_);
                            if (bVar4) {
                              pEVar14 = (EbmlUInteger *)
                                        libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                              local_128 = pEVar14;
                              pIVar15 = libebml::EbmlStream::I_O(this->aStream);
                              (*(pEVar14->super_EbmlElement)._vptr_EbmlElement[10])
                                        (pEVar14,pIVar15,1);
                              pFVar3 = _stderr;
                              uVar8 = libebml::EbmlUInteger::operator_cast_to_unsigned_int
                                                (local_128);
                              fprintf(pFVar3,"\tPixelHeight : %d\n",(ulong)uVar8);
                            }
                            else {
                              pEVar9 = libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                              iVar7 = (*pEVar9->_vptr_EbmlElement[3])();
                              FrameRate = *(KaxVideoFrameRate **)CONCAT44(extraout_var_11,iVar7);
                              local_130 = ((undefined8 *)CONCAT44(extraout_var_11,iVar7))[1];
                              bVar4 = libebml::EbmlId::operator==
                                                ((EbmlId *)&FrameRate,
                                                 (EbmlId *)
                                                 libmatroska::KaxVideoFrameRate::ClassInfos._8_8_);
                              if (bVar4) {
                                this_00 = (EbmlFloat *)
                                          libebml::EbmlMaster::operator[](pEStack_d8,local_dc);
                                pIVar15 = libebml::EbmlStream::I_O(this->aStream);
                                (*(this_00->super_EbmlElement)._vptr_EbmlElement[10])
                                          (this_00,pIVar15,1);
                                pFVar3 = _stderr;
                                fVar16 = libebml::EbmlFloat::operator_cast_to_float(this_00);
                                fprintf(pFVar3,"\tFrameRate : %f\n",(double)fVar16);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pEVar9 = this->m_element3a;
          pEVar1 = this->aStream;
          iVar7 = (*this->m_element3a->_vptr_EbmlElement[4])();
          libebml::EbmlElement::SkipData
                    (pEVar9,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_12,iVar7) + 0x18)
                     ,(EbmlElement *)0x0,false);
          if (this->m_element3a != (EbmlElement *)0x0) {
            (*this->m_element3a->_vptr_EbmlElement[1])();
          }
          pEVar1 = this->aStream;
          iVar7 = (*this->m_element2a->_vptr_EbmlElement[4])();
          pEVar9 = libebml::EbmlStream::FindNextElement
                             (pEVar1,*(EbmlSemanticContext **)
                                      (CONCAT44(extraout_var_13,iVar7) + 0x18),
                              &this->m_upperElementa,0xffffffff,(bool)(this->m_allowDummy & 1),1);
          this->m_element3a = pEVar9;
        }
        if ((trackUID._3_1_ & 1) != 0) {
          this->m_trackNr = local_28;
          this->m_trackUID = local_2c;
        }
      }
      if (0 < this->m_upperElementa) break;
      pEVar9 = this->m_element2a;
      pEVar1 = this->aStream;
      iVar7 = (*this->m_element2a->_vptr_EbmlElement[4])();
      libebml::EbmlElement::SkipData
                (pEVar9,pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_14,iVar7) + 0x18),
                 (EbmlElement *)0x0,false);
      if (this->m_element2a != (EbmlElement *)0x0) {
        (*this->m_element2a->_vptr_EbmlElement[1])();
      }
      pEVar1 = this->aStream;
      iVar7 = (*this->m_element1->_vptr_EbmlElement[4])();
      pEVar9 = libebml::EbmlStream::FindNextElement
                         (pEVar1,*(EbmlSemanticContext **)(CONCAT44(extraout_var_15,iVar7) + 0x18),
                          &this->m_upperElementa,0xffffffff,(bool)(this->m_allowDummy & 1),1);
      this->m_element2a = pEVar9;
    }
    this->m_upperElementa = this->m_upperElementa + -1;
    if (this->m_element2a != (EbmlElement *)0x0) {
      (*this->m_element2a->_vptr_EbmlElement[1])();
    }
    this->m_element2a = this->m_element3a;
  } while (this->m_upperElementa < 1);
LAB_001b2f72:
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void MkvInterface::handleTracksData()
{
    // handle the data in Tracks here.
    // poll for new tracks and handle them
    m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);

    while (m_element2a != NULL) 
    {
        if (m_upperElementa > 0) break;
        if (m_upperElementa < 0) m_upperElementa = 0;
        
        if (EbmlId(*m_element2a) == KaxTrackEntry::ClassInfos.GlobalId)
        {
            m_element3a = aStream->FindNextElement(m_element2a->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
            
            bool videoTrackFound = false;
            int trackNr = -1, trackUID = -1;
            
            while (m_element3a != NULL)
            {
                if (m_upperElementa > 0)
                    break;
                if (m_upperElementa < 0)
                    m_upperElementa = 0;
                    
                // read the data we care about in a track
                // Track number
                if (EbmlId(*m_element3a) == KaxTrackNumber::ClassInfos.GlobalId)
                {
                    KaxTrackNumber & TrackNum = *static_cast<KaxTrackNumber*>(m_element3a);
                    TrackNum.ReadData(aStream->I_O());
                    trackNr = uint8(TrackNum);
                    fprintf(stderr, "\tTrack # %d\n", trackNr);
                }
                
                // Track type
                else if (EbmlId(*m_element3a) == KaxTrackType::ClassInfos.GlobalId)
                {
                    KaxTrackType & TrackType = *static_cast<KaxTrackType*>(m_element3a);
                    TrackType.ReadData(aStream->I_O());
                    fprintf(stderr, "\tTrack type : ");
                    switch(uint8(TrackType))
                    {
                        case track_audio:
                            fprintf(stderr, "Audio");
                            break;
                        case track_video:
                            fprintf(stderr, "Video");
                            videoTrackFound = true;
                            break;
                        default:
                            fprintf(stderr, "unknown");
                    }
                    fprintf(stderr, "\n");
                }

                else if (EbmlId(*m_element3a) == KaxTrackFlagLacing::ClassInfos.GlobalId)
                {
                    fprintf(stderr, "\tFlag Lacing\n");
                }
                else if (EbmlId(*m_element3a) == KaxCodecID::ClassInfos.GlobalId)
                {
                    KaxCodecID & CodecID = *static_cast<KaxCodecID*>(m_element3a);
                    CodecID.ReadData(aStream->I_O());
                    fprintf(stderr, "\tCodec ID   : %s\n", std::string(CodecID).c_str());
                }
                else if (EbmlId(*m_element3a) == KaxTrackUID::ClassInfos.GlobalId)
                {
                    KaxTrackUID & TrackUID = *static_cast<KaxTrackUID*>(m_element3a);
                    TrackUID.ReadData(aStream->I_O());
                    trackUID = (unsigned int)TrackUID;
                    fprintf(stderr, "\tTrack UID   : %d\n", trackUID);
                }
                else if (EbmlId(*m_element3a) == KaxTrackVideo::ClassInfos.GlobalId)
                {
                    KaxTrackVideo & TrackVideo = *static_cast<KaxTrackVideo*>(m_element3a);
                    for (unsigned int j = 0; j<TrackVideo.ListSize(); j++)
                    {
                        if (EbmlId(*TrackVideo[j]) == KaxVideoFlagInterlaced::ClassInfos.GlobalId) 
                        {
	                        KaxVideoFlagInterlaced &Interlaced = *static_cast<KaxVideoFlagInterlaced*>(TrackVideo[j]);
	                        Interlaced.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tInterlaced : %d\n", (unsigned int)Interlaced);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoPixelWidth::ClassInfos.GlobalId)
                        {
	                        KaxVideoPixelWidth &PixelWidth = *static_cast<KaxVideoPixelWidth*>(TrackVideo[j]);
	                        PixelWidth.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tPixelWidth : %d\n", (unsigned int)PixelWidth);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoPixelHeight::ClassInfos.GlobalId)
                        {
	                        KaxVideoPixelHeight &PixelHeight = *static_cast<KaxVideoPixelHeight*>(TrackVideo[j]);
	                        PixelHeight.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tPixelHeight : %d\n", (unsigned int)PixelHeight);
                        }
                        else if (EbmlId(*TrackVideo[j]) == KaxVideoFrameRate::ClassInfos.GlobalId)
                        {
	                        KaxVideoFrameRate &FrameRate = *static_cast<KaxVideoFrameRate*>(TrackVideo[j]);
	                        FrameRate.ReadData(aStream->I_O());
	                        fprintf(stderr, "\tFrameRate : %f\n", (float)FrameRate);
                        }				
                    }
                }
                
                m_element3a->SkipData(*aStream, m_element3a->Generic().Context);
                delete m_element3a;

                m_element3a = aStream->FindNextElement(m_element2a->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
            }
            
            if (videoTrackFound)
            {
                m_trackNr = trackNr;
                m_trackUID = trackUID;
            }
        }
        if (m_upperElementa > 0)
        {
            m_upperElementa--;
            delete m_element2a;
            m_element2a = m_element3a;
            if (m_upperElementa > 0)
                break;
        } 
        else
        {
            m_element2a->SkipData(*aStream, m_element2a->Generic().Context);
            delete m_element2a;

            m_element2a = aStream->FindNextElement(m_element1->Generic().Context, m_upperElementa, 0xFFFFFFFFL, m_allowDummy);
        }
    }
    fprintf(stderr, "\n");
}